

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O2

void nni_msgq_fini(nni_msgq *mq)

{
  nni_msg *m;
  uint uVar1;
  
  if (mq != (nni_msgq *)0x0) {
    nni_mtx_fini(&mq->mq_lock);
    while (mq->mq_len != 0) {
      uVar1 = mq->mq_get + 1;
      if (mq->mq_alloc <= uVar1) {
        uVar1 = 0;
      }
      m = mq->mq_msgs[mq->mq_get];
      mq->mq_get = uVar1;
      mq->mq_len = mq->mq_len - 1;
      nni_msg_free(m);
    }
    nni_pollable_fini(&mq->mq_sendable);
    nni_pollable_fini(&mq->mq_recvable);
    nni_free(mq->mq_msgs,(ulong)mq->mq_alloc << 3);
    nni_free(mq,0x98);
    return;
  }
  return;
}

Assistant:

void
nni_msgq_fini(nni_msgq *mq)
{
	if (mq == NULL) {
		return;
	}
	nni_mtx_fini(&mq->mq_lock);

	/* Free any orphaned messages. */
	while (mq->mq_len > 0) {
		nni_msg *msg = mq->mq_msgs[mq->mq_get++];
		if (mq->mq_get >= mq->mq_alloc) {
			mq->mq_get = 0;
		}
		mq->mq_len--;
		nni_msg_free(msg);
	}

	nni_pollable_fini(&mq->mq_sendable);
	nni_pollable_fini(&mq->mq_recvable);

	nni_free(mq->mq_msgs, mq->mq_alloc * sizeof(nng_msg *));
	NNI_FREE_STRUCT(mq);
}